

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O2

VertexAlignment *
s2polyline_alignment::AlignmentFn
          (VertexAlignment *__return_storage_ptr__,S2Polyline *a,S2Polyline *b,bool approx)

{
  undefined3 in_register_00000009;
  
  if (CONCAT31(in_register_00000009,approx) == 0) {
    GetExactVertexAlignment(__return_storage_ptr__,a,b);
  }
  else {
    GetApproxVertexAlignment(__return_storage_ptr__,a,b);
  }
  return __return_storage_ptr__;
}

Assistant:

VertexAlignment AlignmentFn(const S2Polyline& a, const S2Polyline& b,
                            bool approx) {
  return approx ? GetApproxVertexAlignment(a, b)
                : GetExactVertexAlignment(a, b);
}